

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

void __thiscall maths::Matrix::~Matrix(Matrix *this)

{
  int iVar1;
  long lVar2;
  
  iVar1 = this->rows_;
  if (0 < iVar1) {
    lVar2 = 0;
    do {
      if (this->p[lVar2] != (double *)0x0) {
        operator_delete__(this->p[lVar2]);
        iVar1 = this->rows_;
      }
      lVar2 = lVar2 + 1;
    } while (lVar2 < iVar1);
  }
  if (this->p != (double **)0x0) {
    operator_delete__(this->p);
    return;
  }
  return;
}

Assistant:

Matrix::~Matrix()
{
    for (int i = 0; i < rows_; ++i) {
        delete[] p[i];
    }
    delete[] p;
}